

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O1

void __thiscall Executor::visit(Executor *this,AssignmentNode *node)

{
  AssignmentOperator *__k;
  pointer pcVar1;
  element_type *peVar2;
  Value *pVVar3;
  undefined8 value;
  uint uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Storage<std::reference_wrapper<RuntimeSymbol>,_true> _Var5;
  mapped_type *pmVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  Executor *pEVar7;
  optional<std::reference_wrapper<RuntimeSymbol>_> oVar8;
  NumberValueAnalyser valueAnalyser;
  string name;
  RuntimeVariableAnalyser analyser;
  Executor executor;
  _Elt_pointer local_308;
  TypeName local_2fc;
  undefined1 local_2f8 [32];
  undefined **local_2d8;
  undefined1 local_2d0;
  _Elt_pointer local_2c8;
  char local_2c0;
  string local_2b8;
  RuntimeVariableAnalyser local_298;
  undefined1 local_260 [560];
  
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  pcVar1 = (node->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,pcVar1,pcVar1 + (node->name_)._M_string_length);
  oVar8 = Context::lookup(&this->context_,&local_2b8,0);
  _Var5 = oVar8.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>._M_payload.
          super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_>._M_payload;
  if (node->operator_ == Assign) {
    local_260._8_8_ =
         (node->value_).super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_260._16_8_ =
         (node->value_).super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._16_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._16_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._16_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._16_8_)->_M_use_count + 1;
      }
    }
    local_260._0_8_ = &PTR__ValueChanger_001f4718;
    if (((undefined1  [16])
         oVar8.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>._M_payload.
         super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_> &
        (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__throw_bad_optional_access();
    }
    (**(code **)(*(long *)_Var5 + 0x10))(_Var5,local_260);
    local_260._0_8_ = &PTR__ValueChanger_001f4718;
    local_298.value_.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._16_8_;
    goto LAB_0015f25e;
  }
  RuntimeVariableAnalyser::RuntimeVariableAnalyser(&local_298);
  if (((undefined1  [16])
       oVar8.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>._M_payload.
       super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_> & (undefined1  [16])0x1)
      == (undefined1  [16])0x0) {
    std::__throw_bad_optional_access();
  }
  (**(code **)(*(long *)_Var5 + 0x10))(_Var5,&local_298);
  Executor((Executor *)local_260,
           (Context *)
           local_298.context_.
           super__Optional_base<std::reference_wrapper<const_Context>,_true,_true>._M_payload.
           super__Optional_payload_base<std::reference_wrapper<const_Context>_>._M_payload);
  (*((local_298.value_.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_Node)._vptr_Node[2])
            (local_298.value_.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             local_260);
  value = local_260._8_8_;
  __k = &node->operator_;
  local_2d8 = &PTR__ValueVisitor_001f52a8;
  local_2d0 = 0;
  local_2c0 = '\0';
  local_2fc = F32;
  pmVar6 = std::__detail::
           _Map_base<AssignmentOperator,_std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<AssignmentOperator>,_std::hash<AssignmentOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<AssignmentOperator,_std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<AssignmentOperator>,_std::hash<AssignmentOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&AssignmentOperationNames_abi_cxx11_,__k);
  pEVar7 = (Executor *)local_2f8;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pEVar7,
                 "assignment operation ",pmVar6);
  assertValueType(pEVar7,(Value *)value,&local_2fc,(string *)local_2f8,(Node *)node);
  if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
    operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
  }
  (**(code **)(*(long *)local_260._8_8_ + 0x18))(local_260._8_8_,&local_2d8);
  local_308 = local_2c8;
  if (local_2c0 == '\0') {
    std::__throw_bad_optional_access();
  }
  peVar2 = (node->value_).super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar2->super_Node)._vptr_Node[2])(peVar2,this);
  pVVar3 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
           super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
           super__Head_base<0UL,_Value_*,_false>._M_head_impl;
  local_2fc = F32;
  pmVar6 = std::__detail::
           _Map_base<AssignmentOperator,_std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<AssignmentOperator>,_std::hash<AssignmentOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<AssignmentOperator,_std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<AssignmentOperator>,_std::hash<AssignmentOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&AssignmentOperationNames_abi_cxx11_,__k);
  pEVar7 = (Executor *)local_2f8;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pEVar7,
                 "assignment operation ",pmVar6);
  assertValueType(pEVar7,pVVar3,&local_2fc,(string *)local_2f8,(Node *)node);
  if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
    operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
  }
  pVVar3 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
           super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
           super__Head_base<0UL,_Value_*,_false>._M_head_impl;
  (*pVVar3->_vptr_Value[3])(pVVar3,&local_2d8);
  if (local_2c0 == '\0') {
    std::__throw_bad_optional_access();
  }
  switch(*__k) {
  case PlusEq:
    local_308 = (_Elt_pointer)((double)local_308 + (double)local_2c8);
    break;
  case MinusEq:
    local_308 = (_Elt_pointer)((double)local_308 - (double)local_2c8);
    break;
  case MulEq:
    local_308 = (_Elt_pointer)((double)local_308 * (double)local_2c8);
    break;
  case DivEq:
    local_308 = (_Elt_pointer)((double)local_308 / (double)local_2c8);
    break;
  case AndEq:
    uVar4 = (uint)(long)(double)local_2c8 & (uint)(long)(double)local_308;
    goto LAB_0015f168;
  case OrEq:
    uVar4 = (uint)(long)(double)local_2c8 | (uint)(long)(double)local_308;
    goto LAB_0015f168;
  case XorEq:
    uVar4 = (uint)(long)(double)local_2c8 ^ (uint)(long)(double)local_308;
    goto LAB_0015f168;
  case ShiftLeftEq:
    uVar4 = (int)(long)(double)local_308 << ((byte)(long)(double)local_2c8 & 0x1f);
    goto LAB_0015f168;
  case ShiftRightEq:
    uVar4 = (uint)(long)(double)local_308 >> ((byte)(long)(double)local_2c8 & 0x1f);
LAB_0015f168:
    local_308 = (_Elt_pointer)(double)uVar4;
  }
  local_2f8._16_8_ = operator_new(0x28);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._16_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._16_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._16_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001f49f8;
  local_2f8._8_8_ = local_2f8._16_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2f8._16_8_ + 0x10))->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2f8._16_8_ + 0x10))->_M_weak_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2f8._16_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__Node_001f4a48;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2f8._16_8_ + 0x20))->
  _vptr__Sp_counted_base = (_func_int **)local_308;
  local_2f8._0_8_ = &PTR__ValueChanger_001f4718;
  (**(code **)(*(long *)_Var5 + 0x10))(_Var5);
  local_2f8._0_8_ = &PTR__ValueChanger_001f4718;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._16_8_);
  }
  local_260._0_8_ = &PTR__Executor_001f4940;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_260 + 0xb0));
  std::ios_base::~ios_base((ios_base *)(local_260 + 0x120));
  std::
  deque<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::allocator<std::unique_ptr<Value,_std::default_delete<Value>_>_>_>
  ::~deque((deque<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::allocator<std::unique_ptr<Value,_std::default_delete<Value>_>_>_>
            *)(local_260 + 0x60));
  std::
  deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
  ::~deque((deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
            *)(local_260 + 0x10));
  if ((_Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>)local_260._8_8_ != (Value *)0x0) {
    (**(code **)(*(long *)local_260._8_8_ + 8))();
  }
  local_298.super_RuntimeSymbolVisitor._vptr_RuntimeSymbolVisitor =
       (_func_int **)&PTR__RuntimeVariableAnalyser_001f46b8;
LAB_0015f25e:
  if (local_298.value_.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_298.value_.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Executor::visit(const AssignmentNode& node)
{
  const auto name = node.getName();
  auto symbol = context_.lookup(name);
  if(node.getOperation() == AssignmentOperator::Assign)
  {
    ValueChanger valueChanger{node.getValue()};
    symbol.value().get().accept(valueChanger);
  }
  else
  {
    RuntimeVariableAnalyser analyser{};
    symbol.value().get().accept(analyser);
    Executor executor{analyser.getContext()};
    analyser.getValue()->accept(executor);

    NumberValueAnalyser valueAnalyser{};

    assertValueType(*executor.getValue(), TypeName::F32,
                    "assignment operation " + AssignmentOperationNames.at(node.getOperation()), node);

    executor.getValue()->accept(valueAnalyser);
    const auto oldValue = valueAnalyser.getValue().value();

    node.getValue()->accept(*this);

    assertValueType(*value_, TypeName::F32,
      "assignment operation " + AssignmentOperationNames.at(node.getOperation()), node);

    value_->accept(valueAnalyser);
    const auto rhs = valueAnalyser.getValue().value();

    double newValue = oldValue;
    switch(node.getOperation())
    {
      case AssignmentOperator::PlusEq:
        newValue = oldValue + rhs;
        break;
      case AssignmentOperator::MinusEq:
        newValue = oldValue - rhs;
        break;
      case AssignmentOperator::MulEq:
        newValue = oldValue * rhs;
        break;
      case AssignmentOperator::DivEq:
        newValue = oldValue / rhs;
        break;
      case AssignmentOperator::OrEq:
        newValue = static_cast<unsigned int>(oldValue) | static_cast<unsigned int>(rhs);
        break;
      case AssignmentOperator::AndEq:
        newValue = static_cast<unsigned int>(oldValue) & static_cast<unsigned int>(rhs);
        break;
      case AssignmentOperator::XorEq:
        newValue = static_cast<unsigned int>(oldValue) ^ static_cast<unsigned int>(rhs);
        break;
      case AssignmentOperator::ShiftLeftEq:
        newValue = static_cast<unsigned int>(oldValue) << static_cast<unsigned int>(rhs);
        break;
      case AssignmentOperator::ShiftRightEq:
        newValue = static_cast<unsigned int>(oldValue) >> static_cast<unsigned int>(rhs);
        break;
      case AssignmentOperator::Assign:
        break; // Unreachable
    }

    ValueChanger valueChanger{std::make_shared<NumericLiteralNode>(newValue)};
    symbol.value().get().accept(valueChanger);
  }
}